

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_HRR_Algorithm_Base::OSTEI_HRR_Algorithm_Base
          (OSTEI_HRR_Algorithm_Base *this,OSTEI_GeneratorInfo *info)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__OSTEI_HRR_Algorithm_Base_00199c28;
  OSTEI_GeneratorInfo::OSTEI_GeneratorInfo((OSTEI_GeneratorInfo *)this,info);
  std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::set
            ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)0x131dc3);
  std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>::set
            ((set<DAM,_std::less<DAM>,_std::allocator<DAM>_> *)0x131dd3);
  std::
  map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
  ::map((map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
         *)0x131de3);
  std::
  map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
  ::map((map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
         *)0x131df3);
  std::
  map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
  ::map((map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
         *)0x131e03);
  std::
  map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
  ::map((map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
         *)0x131e13);
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x131e23);
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x131e33);
  std::vector<QAM,_std::allocator<QAM>_>::vector((vector<QAM,_std::allocator<QAM>_> *)0x131e43);
  std::map<QAM,_DoubletType,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_DoubletType>_>_>::
  map((map<QAM,_DoubletType,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_DoubletType>_>_> *)
      0x131e53);
  return;
}

Assistant:

OSTEI_HRR_Algorithm_Base::OSTEI_HRR_Algorithm_Base(const OSTEI_GeneratorInfo & info)
    : info_(info)
{
}